

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode add_next_timeout(timeval now,Curl_multi *multi,Curl_easy *d)

{
  curl_llist *list_00;
  curl_llist_element *pcVar1;
  __time_t *p_Var2;
  timeval *ptVar3;
  time_t tVar4;
  Curl_tree *pCVar5;
  time_t diff;
  curl_llist_element *n;
  curl_llist_element *e;
  curl_llist *list;
  timeval *tv;
  Curl_easy *d_local;
  Curl_multi *multi_local;
  timeval now_local;
  
  ptVar3 = &(d->state).expiretime;
  list_00 = (d->state).timeoutlist;
  n = list_00->head;
  while (n != (curl_llist_element *)0x0) {
    pcVar1 = n->next;
    tVar4 = curlx_tvdiff(*(timeval *)n->ptr,now);
    if (0 < tVar4) break;
    Curl_llist_remove(list_00,n,(void *)0x0);
    n = pcVar1;
  }
  pcVar1 = list_00->head;
  if (pcVar1 == (curl_llist_element *)0x0) {
    ptVar3->tv_sec = 0;
    (d->state).expiretime.tv_usec = 0;
  }
  else {
    p_Var2 = (__time_t *)pcVar1->ptr;
    ptVar3->tv_sec = *p_Var2;
    (d->state).expiretime.tv_usec = p_Var2[1];
    Curl_llist_remove(list_00,pcVar1,(void *)0x0);
    pCVar5 = Curl_splayinsert(*ptVar3,multi->timetree,&(d->state).timenode);
    multi->timetree = pCVar5;
  }
  return CURLM_OK;
}

Assistant:

static CURLMcode add_next_timeout(struct timeval now,
                                  struct Curl_multi *multi,
                                  struct Curl_easy *d)
{
  struct timeval *tv = &d->state.expiretime;
  struct curl_llist *list = d->state.timeoutlist;
  struct curl_llist_element *e;

  /* move over the timeout list for this specific handle and remove all
     timeouts that are now passed tense and store the next pending
     timeout in *tv */
  for(e = list->head; e;) {
    struct curl_llist_element *n = e->next;
    time_t diff = curlx_tvdiff(*(struct timeval *)e->ptr, now);
    if(diff <= 0)
      /* remove outdated entry */
      Curl_llist_remove(list, e, NULL);
    else
      /* the list is sorted so get out on the first mismatch */
      break;
    e = n;
  }
  e = list->head;
  if(!e) {
    /* clear the expire times within the handles that we remove from the
       splay tree */
    tv->tv_sec = 0;
    tv->tv_usec = 0;
  }
  else {
    /* copy the first entry to 'tv' */
    memcpy(tv, e->ptr, sizeof(*tv));

    /* remove first entry from list */
    Curl_llist_remove(list, e, NULL);

    /* insert this node again into the splay */
    multi->timetree = Curl_splayinsert(*tv, multi->timetree,
                                       &d->state.timenode);
  }
  return CURLM_OK;
}